

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O2

int32_t MsgHelper::serializeMsg(PipeMsg *msg,uint8_t *buf)

{
  PIPEMSG_TYPE PVar1;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  uint32_t value;
  
  PVar1 = msg->type;
  *buf = PVar1;
  switch(PVar1) {
  case C2S_REQUEST:
    buf[1] = (msg->field_1).c2s_request.CMD;
    iVar4 = serializeAddr(&(msg->field_1).c2s_request.ADDR,buf + 2);
    if (iVar4 == 0) {
      uVar3 = 0x3f;
      goto LAB_001372f4;
    }
    value = iVar4 + 2;
    break;
  case S2C_RESPONSE:
    buf[1] = (msg->field_1).c2s_request.CMD;
    value = 2;
    break;
  case SEND_TCP_DATA:
    buf[1] = (uint8_t)(msg->field_1).c2s_request.ADDR.PORT;
    uVar3 = (msg->field_1).common_tcp_data.LEN;
    value = uVar3 + 6;
    writeUint32InBigEndian(buf + 2,value);
    memcpy(buf + 6,(msg->field_1).common_tcp_data.DATA,(ulong)uVar3);
    break;
  case C2S_UDP_DATA:
  case S2C_UDP_DATA:
    buf[1] = (uint8_t)(msg->field_1).c2s_request.ADDR.PORT;
    uVar3 = serializeAddr((S5AddrInfo *)((msg->field_1).c2s_request.ADDR.ADDR + 10),buf + 6);
    if (uVar3 == 0) {
      uVar3 = 0x5d;
      goto LAB_001372f4;
    }
    uVar2 = (msg->field_1).common_tcp_data.LEN;
    value = uVar3 + uVar2 + 6;
    memcpy(buf + (ulong)uVar3 + 6,(msg->field_1).common_tcp_data.DATA,(ulong)uVar2);
    writeUint32InBigEndian(buf + 2,value);
    break;
  case S2C_DISCONNECT:
  case S2C_CANNOT_RESOLVE_ADDR:
    value = 1;
    break;
  default:
    uVar3 = 0x74;
LAB_001372f4:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                  ,uVar3,"static int32_t MsgHelper::serializeMsg(const PipeMsg *, uint8_t *)");
  }
  return value;
}

Assistant:

int32_t MsgHelper::serializeMsg(const PipeMsg *msg, uint8_t *buf)
{
	buf[0] = msg->type;
	switch(msg->type)
	{
		case PIPEMSG_TYPE::C2S_REQUEST:
		{
			buf[1] = msg->c2s_request.CMD;

			auto len = serializeAddr(&msg->c2s_request.ADDR, buf + 2);
			if(len <= 0)
			{
				assert(0);
				return SERIALIZE_FAIL;
			}
			return 2 + len;
		}break;
		case PIPEMSG_TYPE::S2C_RESPONSE:
		{
			buf[1] = (uint8_t)msg->s2c_response.CODE;
			return 2;
		}break;
		case PIPEMSG_TYPE::SEND_TCP_DATA:
		{
			buf[1] = msg->common_tcp_data.METHOD;

			uint32_t dataLen = msg->common_tcp_data.LEN;
			uint32_t msgLen = dataLen + 6;

			writeUint32InBigEndian(&buf[2], msgLen);
			memcpy(&buf[6], msg->common_tcp_data.DATA, dataLen);

			return msgLen;

		}break;
		case PIPEMSG_TYPE::C2S_UDP_DATA:
		case PIPEMSG_TYPE::S2C_UDP_DATA:
		{
			buf[1] = msg->common_udp_data.METHOD;
			auto len = serializeAddr(&msg->common_udp_data.ADDR, buf + 6);
			if(len <= 0)
			{
				assert(0);
				return SERIALIZE_FAIL;
			}

			auto dataLen = msg->common_udp_data.LEN;
			uint32_t msgLen = 6 + len + dataLen;

			// DATA
			memcpy(&buf[6 + len], msg->common_udp_data.DATA, dataLen);
			// LEN
			writeUint32InBigEndian(&buf[2], msgLen);

			return msgLen;
		}break;
		case PIPEMSG_TYPE::S2C_DISCONNECT:
		{
			return 1;
		}break;
		case PIPEMSG_TYPE::S2C_CANNOT_RESOLVE_ADDR:
		{
			return 1;
		}break;
	}
	assert(0);
	return SERIALIZE_FAIL;
}